

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseMessage_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  string *psVar1;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_58,"message_id",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->messageId);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"from",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                from);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"date",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->date);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"chat",&local_59);
    psVar1 = &local_38;
    parseChat_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                chat);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"forward_from",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                forwardFrom);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"forward_from_chat",&local_59);
    psVar1 = &local_38;
    parseChat_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                forwardFromChat);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string
              ((string *)&local_58,"forward_from_message_id",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->forwardFromMessageId);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"forward_signature",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->forwardSignature);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"forward_date",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->forwardDate);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"reply_to_message",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                replyToMessage);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"edit_date",(allocator *)&local_38);
    appendToJson<int>(this,__return_storage_ptr__,&local_58,
                      &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->editDate);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"author_signature",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->authorSignature);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"text",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->text);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"audio",&local_59);
    psVar1 = &local_38;
    parseAudio_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                audio);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"document",&local_59);
    psVar1 = &local_38;
    parseDocument_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                document);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"animation",&local_59);
    psVar1 = &local_38;
    parseAnimation_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                animation);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"photo",&local_59);
    psVar1 = &local_38;
    parseArray<TgBot::PhotoSize>
              (psVar1,this,0x1e5fe8,
               (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                *)0x0);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"sticker",&local_59);
    psVar1 = &local_38;
    parseSticker_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                sticker);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"video",&local_59);
    psVar1 = &local_38;
    parseVideo_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                video);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"contact",&local_59);
    psVar1 = &local_38;
    parseContact_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                contact);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"location",&local_59);
    psVar1 = &local_38;
    parseLocation_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                location);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"new_chat_member",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                newChatMember);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"new_chat_members",&local_59);
    psVar1 = &local_38;
    parseArray<TgBot::User>
              (psVar1,this,0x1e3450,
               (vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>
                *)0x0);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"left_chat_member",&local_59);
    psVar1 = &local_38;
    parseUser_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                leftChatMember);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"new_chat_title",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->newChatTitle);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"new_chat_photo",&local_59);
    psVar1 = &local_38;
    parseArray<TgBot::PhotoSize>
              (psVar1,this,0x1e5fe8,
               (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                *)0x0);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"delete_chat_photo",(allocator *)&local_38);
    appendToJson(this,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->deleteChatPhoto);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"group_chat_created",(allocator *)&local_38);
    appendToJson(this,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->groupChatCreated);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"caption",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->caption);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string
              ((string *)&local_58,"supergroup_chat_created",(allocator *)&local_38);
    appendToJson(this,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->supergroupChatCreated);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"channel_chat_created",(allocator *)&local_38);
    appendToJson(this,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->channelChatCreated);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"migrate_to_chat_id",(allocator *)&local_38);
    appendToJson<long>(this,__return_storage_ptr__,&local_58,
                       &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->migrateToChatId);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"migrate_from_chat_id",(allocator *)&local_38);
    appendToJson<long>(this,__return_storage_ptr__,&local_58,
                       &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->migrateFromChatId);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"pinned_message",&local_59);
    psVar1 = &local_38;
    parseMessage_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                pinnedMessage);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    psVar1 = &local_58;
    std::__cxx11::string::string((string *)psVar1,"connected_website",(allocator *)&local_38);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,
                 &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->connectedWebsite);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"invoice",&local_59);
    psVar1 = &local_38;
    parseInvoice_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                invoice);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)&local_58,"successful_payment",&local_59);
    psVar1 = &local_38;
    parseSuccessfulPayment_abi_cxx11_
              (psVar1,this,
               &((object->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                successfulPayment);
    appendToJson((TgTypeParser *)psVar1,__return_storage_ptr__,&local_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseMessage(const Message::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "message_id", object->messageId);
    appendToJson(result, "from", parseUser(object->from));
    appendToJson(result, "date", object->date);
    appendToJson(result, "chat", parseChat(object->chat));
    appendToJson(result, "forward_from", parseUser(object->forwardFrom));
    appendToJson(result, "forward_from_chat", parseChat(object->forwardFromChat));
    appendToJson(result, "forward_from_message_id", object->forwardFromMessageId);
    appendToJson(result, "forward_signature", object->forwardSignature);
    appendToJson(result, "forward_date", object->forwardDate);
    appendToJson(result, "reply_to_message", parseMessage(object->replyToMessage));
    appendToJson(result, "edit_date", object->editDate);
    appendToJson(result, "author_signature", object->authorSignature);
    appendToJson(result, "text", object->text);
    appendToJson(result, "audio", parseAudio(object->audio));
    appendToJson(result, "document", parseDocument(object->document));
    appendToJson(result, "animation", parseAnimation(object->animation));
    appendToJson(result, "photo", parseArray(&TgTypeParser::parsePhotoSize, object->photo));
    appendToJson(result, "sticker", parseSticker(object->sticker));
    appendToJson(result, "video", parseVideo(object->video));
    appendToJson(result, "contact", parseContact(object->contact));
    appendToJson(result, "location", parseLocation(object->location));
    appendToJson(result, "new_chat_member", parseUser(object->newChatMember));
    appendToJson(result, "new_chat_members", parseArray(&TgTypeParser::parseUser, object->newChatMembers));
    appendToJson(result, "left_chat_member", parseUser(object->leftChatMember));
    appendToJson(result, "new_chat_title", object->newChatTitle);
    appendToJson(result, "new_chat_photo", parseArray(&TgTypeParser::parsePhotoSize, object->newChatPhoto));
    appendToJson(result, "delete_chat_photo", object->deleteChatPhoto);
    appendToJson(result, "group_chat_created", object->groupChatCreated);
    appendToJson(result, "caption", object->caption);
    appendToJson(result, "supergroup_chat_created", object->supergroupChatCreated);
    appendToJson(result, "channel_chat_created", object->channelChatCreated);
    appendToJson(result, "migrate_to_chat_id", object->migrateToChatId);
    appendToJson(result, "migrate_from_chat_id", object->migrateFromChatId);
    appendToJson(result, "pinned_message", parseMessage(object->pinnedMessage));
    appendToJson(result, "connected_website", object->connectedWebsite);
    appendToJson(result, "invoice", parseInvoice(object->invoice));
    appendToJson(result, "successful_payment", parseSuccessfulPayment(object->successfulPayment));
    removeLastComma(result);
    result += '}';
    return result;
}